

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O3

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,HAXX::quaternion<double>,(char)84>
               (void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  quaternion<double> ALPHA_00;
  quaternion<double> BETA_00;
  undefined1 auVar22 [32];
  double dVar23;
  pointer pqVar24;
  quaternion<double> *pqVar25;
  quaternion<double> *X;
  ostream *poVar26;
  basic_ostream<char,_std::char_traits<char>_> *pbVar27;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  quaternion<double> *pqVar28;
  quaternion<double> *x;
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar37 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar104 [32];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  quaternion<double> BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  stringstream ss;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_2c8;
  quaternion<double> *local_2b0;
  quaternion<double> local_2a8;
  undefined **local_288;
  undefined8 uStack_280;
  undefined8 *puStack_278;
  char **ppcStack_270;
  quaternion<double> local_268;
  quaternion<double> local_248;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_228;
  undefined1 local_210 [8];
  undefined8 local_208;
  shared_count sStack_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar64 [32];
  undefined1 auVar101 [32];
  
  pqVar25 = (quaternion<double> *)operator_new(320000);
  memset(pqVar25,0,320000);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc80);
  pqVar28 = local_2c8.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 100;
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pqVar28;
  memset(local_2c8.
         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,0xc80);
  lVar29 = 0x18;
  local_2c8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pqVar28;
  do {
    local_288 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar79 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar33 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar23 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    dVar34 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar36 = _ZL3dis_1;
    dVar3 = _ZL3dis_0;
    auVar40._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar24 = local_2c8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar4 = _ZL3dis_0;
    auVar40._8_56_ = extraout_var;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar1;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar2;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar3;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = _ZL3dis_0;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_288;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar79 - dVar1;
    auVar105 = vfmadd132sd_fma(auVar45,auVar52,auVar105);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar33;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar23 - dVar2;
    auVar5 = vfmadd132sd_fma(auVar53,auVar67,auVar5);
    *(long *)((long)X + lVar29 + -0x18) = auVar105._0_8_;
    dVar1 = _ZL3dis_1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar34;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar36 - dVar3;
    auVar105 = vfmadd132sd_fma(auVar68,auVar80,auVar6);
    *(long *)((long)X + lVar29 + -0x10) = auVar5._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar1 - dVar4;
    auVar5 = vfmadd213sd_fma(auVar81,auVar40._0_16_,auVar93);
    *(long *)((long)X + lVar29 + -8) = auVar105._0_8_;
    *(long *)((long)&X->_M_real + lVar29) = auVar5._0_8_;
    lVar29 = lVar29 + 0x20;
    pqVar28 = local_2c8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar29 != 0xc98);
  for (; pqVar28 != pqVar24; pqVar28 = pqVar28 + 1) {
    local_288 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar79 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar34 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar23 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    dVar35 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar36 = _ZL3dis_1;
    dVar3 = _ZL3dis_0;
    auVar41._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar33 = _ZL3dis_1;
    dVar4 = _ZL3dis_0;
    auVar41._8_56_ = extraout_var_00;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar1;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar3;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = _ZL3dis_0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_288;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar79 - dVar1;
    auVar105 = vfmadd132sd_fma(auVar46,auVar54,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar34;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar23 - dVar2;
    auVar5 = vfmadd132sd_fma(auVar55,auVar69,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar35;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar36 - dVar3;
    auVar6 = vfmadd132sd_fma(auVar70,auVar82,auVar9);
    pqVar28->_M_real = auVar105._0_8_;
    pqVar28->_M_imag_i = auVar5._0_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar33 - dVar4;
    auVar105 = vfmadd213sd_fma(auVar83,auVar41._0_16_,auVar94);
    pqVar28->_M_imag_j = auVar6._0_8_;
    pqVar28->_M_imag_k = auVar105._0_8_;
  }
  lVar29 = 0x18;
  do {
    local_288 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar79 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar33 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar23 = _ZL3dis_1;
    dVar2 = _ZL3dis_0;
    dVar34 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar36 = _ZL3dis_1;
    dVar3 = _ZL3dis_0;
    auVar42._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar4 = _ZL3dis_0;
    auVar42._8_56_ = extraout_var_01;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar1;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar3;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = _ZL3dis_0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_288;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar79 - dVar1;
    auVar105 = vfmadd132sd_fma(auVar47,auVar56,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar33;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar23 - dVar2;
    auVar5 = vfmadd132sd_fma(auVar57,auVar71,auVar11);
    *(long *)((long)pqVar25 + lVar29 + -0x18) = auVar105._0_8_;
    dVar1 = _ZL3dis_1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar34;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar36 - dVar3;
    auVar105 = vfmadd132sd_fma(auVar72,auVar84,auVar12);
    *(long *)((long)pqVar25 + lVar29 + -0x10) = auVar5._0_8_;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = dVar1 - dVar4;
    auVar5 = vfmadd213sd_fma(auVar85,auVar42._0_16_,auVar95);
    *(long *)((long)pqVar25 + lVar29 + -8) = auVar105._0_8_;
    *(long *)((long)&pqVar25->_M_real + lVar29) = auVar5._0_8_;
    lVar29 = lVar29 + 0x20;
  } while (lVar29 != 0x4e218);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&local_228,&local_2c8);
  local_2b0 = pqVar25;
  local_288 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar4 = _ZL3dis_1;
  dVar1 = _ZL3dis_0;
  dVar36 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar79 = _ZL3dis_1;
  dVar2 = _ZL3dis_0;
  dVar33 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar23 = _ZL3dis_1;
  dVar3 = _ZL3dis_0;
  auVar43._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar43._8_56_ = extraout_var_02;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar3;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = _ZL3dis_0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_288;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar4 - dVar1;
  auVar105 = vfmadd132sd_fma(auVar48,auVar58,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar36;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar79 - dVar2;
  auVar5 = vfmadd132sd_fma(auVar59,auVar73,auVar14);
  local_248._M_real = auVar105._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar33;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar23 - dVar3;
  auVar105 = vfmadd132sd_fma(auVar74,auVar86,auVar15);
  local_248._M_imag_i = auVar5._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar5 = vfmadd213sd_fma(auVar87,auVar43._0_16_,auVar96);
  local_248._M_imag_j = auVar105._0_8_;
  local_248._M_imag_k = auVar5._0_8_;
  local_288 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar4 = _ZL3dis_1;
  dVar1 = _ZL3dis_0;
  dVar36 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar79 = _ZL3dis_1;
  dVar2 = _ZL3dis_0;
  dVar33 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar23 = _ZL3dis_1;
  dVar3 = _ZL3dis_0;
  auVar44._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar44._8_56_ = extraout_var_03;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar2;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar3;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = _ZL3dis_0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_288;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar4 - dVar1;
  auVar105 = vfmadd132sd_fma(auVar49,auVar60,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar36;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar79 - dVar2;
  auVar5 = vfmadd132sd_fma(auVar61,auVar75,auVar17);
  local_268._M_real = auVar105._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar33;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar23 - dVar3;
  auVar105 = vfmadd132sd_fma(auVar76,auVar88,auVar18);
  local_268._M_imag_i = auVar5._0_8_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar5 = vfmadd213sd_fma(auVar89,auVar44._0_16_,auVar97);
  local_268._M_imag_j = auVar105._0_8_;
  local_268._M_imag_k = auVar5._0_8_;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_gemv_square_",0x13);
  local_2a8._M_real = (double)CONCAT71(local_2a8._M_real._1_7_,0x54);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_2a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_LDSame",7);
  std::__cxx11::stringbuf::str();
  poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_2a8._M_real,
                       CONCAT71(local_2a8._M_imag_i._1_7_,local_2a8._M_imag_i._0_1_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar26," will use",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
  std::ostream::put((char)poVar26);
  std::ostream::flush();
  if ((double *)local_2a8._M_real != &local_2a8._M_imag_j) {
    operator_delete((void *)local_2a8._M_real,(long)local_2a8._M_imag_j + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ALPHA = ",10);
  pbVar27 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar27 + -0x18) + (char)pbVar27);
  std::ostream::put((char)pbVar27);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  BETA = ",9);
  pbVar27 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar27 + -0x18) + (char)pbVar27);
  std::ostream::put((char)pbVar27);
  std::ostream::flush();
  ALPHA_00._M_imag_i = local_248._M_imag_i;
  ALPHA_00._M_real = local_248._M_real;
  ALPHA_00._M_imag_j = local_248._M_imag_j;
  ALPHA_00._M_imag_k = local_248._M_imag_k;
  BETA_00._M_imag_i = local_268._M_imag_i;
  BETA_00._M_real = local_268._M_real;
  BETA_00._M_imag_j = local_268._M_imag_j;
  BETA_00._M_imag_k = local_268._M_imag_k;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
            ('T',100,100,ALPHA_00,pqVar25,100,X,1,BETA_00,
             local_2c8.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar29 = 0;
  do {
    HAXX::HBLAS_DOTUV<double>(&local_2a8,100,pqVar25,1,X,1);
    uStack_280 = CONCAT71(local_2a8._M_imag_i._1_7_,local_2a8._M_imag_i._0_1_);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = (undefined **)local_2a8._M_real;
    puStack_278 = (undefined8 *)local_2a8._M_imag_j;
    ppcStack_270 = (char **)local_2a8._M_imag_k;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x47,&local_1d8);
    auVar22._8_8_ = uStack_280;
    auVar22._0_8_ = local_288;
    auVar22._16_8_ = puStack_278;
    auVar22._24_8_ = ppcStack_270;
    auVar21._8_8_ = local_248._M_imag_i;
    auVar21._0_8_ = local_248._M_real;
    auVar21._16_8_ = local_248._M_imag_j;
    auVar21._24_8_ = local_248._M_imag_k;
    auVar19 = vpermpd_avx2(auVar22,0xe9);
    auVar105 = auVar22._16_16_;
    auVar32 = vpermpd_avx2(auVar22,0xe7);
    auVar31 = vshufpd_avx(auVar21,auVar21,0xb);
    auVar20 = vpermpd_avx2(auVar21,0x7a);
    auVar21 = vpermpd_avx2(auVar21,0x9f);
    auVar30 = vpermpd_avx2(auVar22,1);
    auVar63._16_16_ = auVar19._0_16_;
    auVar63._0_16_ = auVar105;
    auVar5 = vshufpd_avx(auVar105,auVar105,1);
    auVar91._0_8_ = auVar31._0_8_ * auVar30._0_8_;
    auVar91._8_8_ = auVar31._8_8_ * auVar30._8_8_;
    auVar91._16_8_ = auVar31._16_8_ * auVar30._16_8_;
    auVar91._24_8_ = auVar31._24_8_ * auVar30._24_8_;
    auVar105 = *(undefined1 (*) [16])
                ((long)&(local_228.
                         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar29);
    auVar30._0_8_ = auVar5._0_8_ * auVar21._0_8_;
    auVar30._8_8_ = auVar5._8_8_ * auVar21._8_8_;
    auVar30._16_8_ = auVar32._0_8_ * auVar21._16_8_;
    auVar30._24_8_ = auVar32._8_8_ * auVar21._24_8_;
    auVar31._8_8_ = local_248._M_real;
    auVar31._0_8_ = local_248._M_real;
    auVar31._16_8_ = local_248._M_real;
    auVar31._24_8_ = local_248._M_real;
    auVar30 = vfmsub231pd_avx512vl(auVar30,auVar22,auVar31);
    auVar52 = vfmadd213pd_fma(auVar63,auVar20,auVar91);
    auVar20._8_8_ = local_268._M_imag_i;
    auVar20._0_8_ = local_268._M_real;
    auVar20._16_8_ = local_268._M_imag_j;
    auVar20._24_8_ = local_268._M_imag_k;
    auVar5 = *(undefined1 (*) [16])
              ((long)&(local_228.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar29);
    auVar19 = vshufpd_avx(auVar20,auVar20,0xb);
    auVar32 = vpermpd_avx2(auVar20,0x7a);
    auVar20 = vpermpd_avx2(auVar20,0x9f);
    auVar31 = *(undefined1 (*) [32])
               ((long)&(local_228.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar29);
    auVar21 = vpermpd_avx2(auVar31,1);
    auVar100._0_8_ = auVar19._0_8_ * auVar21._0_8_;
    auVar100._8_8_ = auVar19._8_8_ * auVar21._8_8_;
    auVar100._16_8_ = auVar19._16_8_ * auVar21._16_8_;
    auVar100._24_8_ = auVar19._24_8_ * auVar21._24_8_;
    auVar6 = vshufpd_avx(auVar105,auVar5,1);
    auVar45 = vunpckhpd_avx(auVar5,auVar105);
    auVar104._16_16_ = auVar6;
    auVar104._0_16_ = auVar5;
    auVar105 = vshufpd_avx(auVar5,auVar5,1);
    auVar5 = vfmadd213pd_fma(auVar104,auVar32,auVar100);
    dVar1 = *(double *)
             ((long)&(local_2c8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar29);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar1;
    auVar32._0_8_ = auVar105._0_8_ * auVar20._0_8_;
    auVar32._8_8_ = auVar105._8_8_ * auVar20._8_8_;
    auVar32._16_8_ = auVar45._0_8_ * auVar20._16_8_;
    auVar32._24_8_ = auVar45._8_8_ * auVar20._24_8_;
    auVar19._8_8_ = local_268._M_real;
    auVar19._0_8_ = local_268._M_real;
    auVar19._16_8_ = local_268._M_real;
    auVar19._24_8_ = local_268._M_real;
    auVar31 = vfmsub231pd_avx512vl(auVar32,auVar31,auVar19);
    dVar2 = *(double *)
             ((long)&(local_2c8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar29);
    dVar3 = *(double *)
             ((long)&(local_2c8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar29);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar3;
    dVar4 = *(double *)
             ((long)&(local_2c8.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar29);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar4;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = dVar2 * dVar2;
    auVar105 = vfmadd231sd_fma(auVar90,auVar77,auVar77);
    local_2a8._M_imag_i._0_1_ = 0;
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1f0 = "";
    auVar38._0_8_ = auVar30._0_8_ + -auVar52._0_8_ + auVar31._0_8_ + -auVar5._0_8_;
    auVar38._8_8_ = auVar30._8_8_ + auVar52._8_8_ + auVar31._8_8_ + auVar5._8_8_;
    auVar38._16_8_ = auVar30._16_8_ + 0.0 + auVar31._16_8_ + 0.0;
    auVar38._24_8_ = auVar30._24_8_ + 0.0 + auVar31._24_8_ + 0.0;
    auVar31 = vpermpd_avx2(auVar38,0xe7);
    auVar105 = vfmadd231sd_fma(auVar105,auVar98,auVar98);
    auVar51._8_8_ = auVar38._16_8_;
    auVar51._0_8_ = auVar38._16_8_;
    auVar51._16_16_ = auVar31._0_16_;
    auVar105 = vfmadd231sd_fma(auVar105,auVar103,auVar103);
    auVar105 = vsqrtsd_avx(auVar105,auVar105);
    dVar79 = auVar105._0_8_;
    auVar62._0_8_ = (dVar2 / dVar79) / dVar79;
    auVar99._0_8_ = (-dVar4 / dVar79) / dVar79;
    auVar78._0_8_ = (-dVar3 / dVar79) / dVar79;
    auVar78._8_8_ = 0x8000000000000000;
    auVar92._0_8_ = (-dVar1 / dVar79) / dVar79;
    auVar62._8_8_ = auVar62._0_8_;
    auVar64._16_8_ = auVar62._0_8_;
    auVar64._0_16_ = auVar62;
    auVar64._24_8_ = auVar62._0_8_;
    auVar99._8_8_ = auVar99._0_8_;
    auVar101._16_8_ = auVar99._0_8_;
    auVar101._0_16_ = auVar99;
    auVar101._24_8_ = auVar99._0_8_;
    auVar92._8_8_ = auVar92._0_8_;
    auVar92._16_8_ = auVar92._0_8_;
    auVar92._24_8_ = auVar92._0_8_;
    auVar105 = vunpcklpd_avx(auVar62,auVar78);
    auVar5 = vunpcklpd_avx(auVar78,auVar62);
    auVar31 = vblendpd_avx(ZEXT1632(auVar105),auVar101,4);
    auVar19 = vblendpd_avx(ZEXT1632(auVar5),auVar64,0xc);
    auVar105 = vunpcklpd_avx(auVar78,auVar99);
    auVar31 = vblendpd_avx(auVar31,auVar92,8);
    auVar32 = vshufpd_avx(auVar38,auVar38,0xb);
    auVar65._0_8_ = auVar32._0_8_ * auVar19._0_8_;
    auVar65._8_8_ = auVar32._8_8_ * auVar19._8_8_;
    auVar65._16_8_ = auVar32._16_8_ * auVar19._16_8_;
    auVar65._24_8_ = auVar32._24_8_ * auVar19._24_8_;
    auVar102._16_16_ = auVar105;
    auVar102._0_16_ = auVar31._16_16_;
    auVar105 = vfmadd231pd_fma(auVar65,auVar51,auVar102);
    auVar32 = vpermt2pd_avx512f(_DAT_002447c0,ZEXT1632(auVar78));
    auVar19 = vpermpd_avx2(auVar38,0x9f);
    auVar39._8_8_ = auVar38._0_8_;
    auVar39._0_8_ = auVar38._0_8_;
    auVar39._16_8_ = auVar38._0_8_;
    auVar39._24_8_ = auVar38._0_8_;
    auVar66._0_8_ = auVar32._0_8_ * auVar19._0_8_;
    auVar66._8_8_ = auVar32._8_8_ * auVar19._8_8_;
    auVar66._16_8_ = auVar32._16_8_ * auVar19._16_8_;
    auVar66._24_8_ = auVar32._24_8_ * auVar19._24_8_;
    auVar5 = vfmsub231pd_fma(auVar66,auVar31,auVar39);
    auVar37._0_8_ = auVar5._0_8_ + -auVar105._0_8_;
    auVar37._8_8_ = auVar5._8_8_ + auVar105._8_8_;
    auVar105 = vshufpd_avx(auVar37,auVar37,1);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (auVar37._0_8_ + -1.0) * (auVar37._0_8_ + -1.0);
    auVar105 = vfmadd213sd_fma(auVar105,auVar105,auVar50);
    auVar5 = vfmadd231sd_fma(auVar105,(undefined1  [16])0x0,(undefined1  [16])0x0);
    auVar105 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
    auVar105 = vfmadd213sd_fma(auVar105,auVar105,auVar5);
    auVar105 = vsqrtsd_avx(auVar105,auVar105);
    local_210[0] = auVar105._0_8_ < 1e-12;
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_1e8 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_1e0 = "";
    local_2a8._M_real = (double)&PTR__lazy_ostream_002658f0;
    local_2a8._M_imag_j = (double)&boost::unit_test::lazy_ostream::inst;
    local_2a8._M_imag_k = (double)&local_1e8;
    boost::test_tools::tt_detail::report_assertion(local_210,&local_2a8,&local_1f8,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_200);
    pqVar25 = pqVar25 + 100;
    lVar29 = lVar29 + 0x20;
  } while (lVar29 != 0xc80);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_228.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pqVar25 = local_2b0;
  if (local_2c8.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (quaternion<double> *)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(pqVar25,320000);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}